

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void __thiscall
ExpressionContext::AddVariable(ExpressionContext *this,VariableData *variable,bool visible)

{
  VariableData **ppVVar1;
  uint uVar2;
  char *__function;
  ScopeData *pSVar3;
  IdentifierLookupResult value;
  
  pSVar3 = this->scope;
  uVar2 = (pSVar3->variables).count;
  if (uVar2 == (pSVar3->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar3->variables,uVar2);
  }
  ppVVar1 = (pSVar3->variables).data;
  if (ppVVar1 != (VariableData **)0x0) {
    uVar2 = (pSVar3->variables).count;
    (pSVar3->variables).count = uVar2 + 1;
    ppVVar1[uVar2] = variable;
    pSVar3 = this->scope;
    uVar2 = (pSVar3->allVariables).count;
    if (uVar2 == (pSVar3->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(&pSVar3->allVariables,uVar2);
    }
    ppVVar1 = (pSVar3->allVariables).data;
    if (ppVVar1 != (VariableData **)0x0) {
      uVar2 = (pSVar3->allVariables).count;
      (pSVar3->allVariables).count = uVar2 + 1;
      ppVVar1[uVar2] = variable;
      uVar2 = (this->variables).count;
      if (uVar2 == (this->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&this->variables,uVar2);
      }
      ppVVar1 = (this->variables).data;
      if (ppVVar1 != (VariableData **)0x0) {
        uVar2 = (this->variables).count;
        (this->variables).count = uVar2 + 1;
        ppVVar1[uVar2] = variable;
        if (visible) {
          pSVar3 = this->scope;
          if (pSVar3->type == SCOPE_NAMESPACE) {
            pSVar3 = this->globalScope;
          }
          uVar2 = NULLC::GetStringHash((variable->name->name).begin,(variable->name->name).end);
          value.function = (FunctionData *)0x0;
          value.variable = variable;
          DirectChainedMap<IdentifierLookupResult>::insert(&pSVar3->idLookupMap,uVar2,value);
          return;
        }
        return;
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_0015e552;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_0015e552:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

void ExpressionContext::AddVariable(VariableData *variable, bool visible)
{
	scope->variables.push_back(variable);
	scope->allVariables.push_back(variable);

	variables.push_back(variable);

	if(visible)
	{
		if(scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.insert(variable->name->name.hash(), IdentifierLookupResult(variable));
		else
			scope->idLookupMap.insert(variable->name->name.hash(), IdentifierLookupResult(variable));
	}
}